

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O2

optional<lambda::Parse_ast> * __thiscall
lambda::parse_from::helper::maybe_parse_term
          (optional<lambda::Parse_ast> *__return_storage_ptr__,helper *this)

{
  int iVar1;
  int iVar2;
  string *this_00;
  string local_170;
  undefined1 local_150 [48];
  string local_120;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_100;
  Variable local_d0;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_b0;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_80;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_50;
  
  while( true ) {
    eat_whitespace(this);
    iVar1 = std::istream::peek();
    if (iVar1 != 0x28) break;
    std::istream::get();
    iVar1 = std::istream::peek();
    if (iVar1 != 0x2a) {
      parse_term((Parse_ast *)&local_100,this);
      goto LAB_00102ca7;
    }
    std::istream::get();
    comment(this);
  }
  if (iVar1 == -1) {
LAB_00102ba9:
    (__return_storage_ptr__->super__Optional_base<lambda::Parse_ast,_false,_false>)._M_payload.
    super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
    super__Optional_payload_base<lambda::Parse_ast>._M_engaged = false;
  }
  else {
    if ((iVar1 == 0x5c) || (iVar1 == 0x2f)) {
      std::istream::get();
      parse_from(std::istream&)::helper::get_var_abi_cxx11_((string *)local_150,this);
      while( true ) {
        eat_whitespace(this);
        iVar1 = std::istream::get();
        if (iVar1 != 0x28) break;
        iVar1 = std::istream::peek();
        if (iVar1 != 0x2a) goto LAB_00102e59;
        std::istream::get();
        comment(this);
      }
      if (iVar1 != 0x2e) {
LAB_00102e59:
        unexpected_thing(this);
      }
      std::istream::get();
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_150 + 0x10)) {
        local_120.field_2._8_8_ = local_150._24_8_;
      }
      else {
        local_120._M_dataplus._M_p = (pointer)local_150._0_8_;
      }
      local_120._M_string_length = local_150._8_8_;
      local_150._8_8_ = 0;
      local_150[0x10] = '\0';
      local_150._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_150 + 0x10);
      parse_term((Parse_ast *)&local_b0,this);
      Parse_ast::Lambda::Lambda((Lambda *)&local_100,&local_120,(Parse_ast *)&local_b0);
      std::_Optional_payload_base<lambda::Parse_ast>::
      _Optional_payload_base<lambda::Parse_ast::Lambda>
                ((_Optional_payload_base<lambda::Parse_ast> *)__return_storage_ptr__,&local_100);
      Parse_ast::Lambda::~Lambda((Lambda *)&local_100);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_b0);
      std::__cxx11::string::~string((string *)&local_120);
      this_00 = (string *)local_150;
    }
    else {
      if (iVar1 == 0x29) goto LAB_00102ba9;
      iVar2 = isalpha(iVar1);
      if ((iVar1 != 0x5f) && (iVar2 == 0)) {
        unexpected_thing(this);
      }
      parse_from(std::istream&)::helper::get_var_abi_cxx11_(&local_170,this);
      local_d0.name_._M_dataplus._M_p = (pointer)&local_d0.name_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p == &local_170.field_2) {
        local_d0.name_.field_2._8_8_ = local_170.field_2._8_8_;
      }
      else {
        local_d0.name_._M_dataplus._M_p = local_170._M_dataplus._M_p;
      }
      local_d0.name_._M_string_length = local_170._M_string_length;
      local_170._M_string_length = 0;
      local_170.field_2._M_local_buf[0] = '\0';
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::variant<lambda::Parse_ast::Variable,lambda::Parse_ast::Call,lambda::Parse_ast::Lambda>::
      variant<lambda::Parse_ast::Variable,void,void,lambda::Parse_ast::Variable,void>
                ((variant<lambda::Parse_ast::Variable,lambda::Parse_ast::Call,lambda::Parse_ast::Lambda>
                  *)&local_80,&local_d0);
      parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
                ((Parse_ast *)&local_100,this,(Parse_ast *)&local_80);
      std::optional<lambda::Parse_ast>::optional<lambda::Parse_ast,_true>
                (__return_storage_ptr__,(Parse_ast *)&local_100);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_100);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_80);
      std::__cxx11::string::~string((string *)&local_d0);
      this_00 = &local_170;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return __return_storage_ptr__;
LAB_00102ca7:
  eat_whitespace(this);
  iVar1 = std::istream::get();
  if (iVar1 != 0x28) {
    if (iVar1 == 0x29) {
      std::istream::get();
      std::__detail::__variant::
      _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)&local_50,
                        (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)&local_100);
      parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
                ((Parse_ast *)local_150,this,(Parse_ast *)&local_50);
      std::optional<lambda::Parse_ast>::optional<lambda::Parse_ast,_true>
                (__return_storage_ptr__,(Parse_ast *)local_150);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           *)local_150);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_50);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_100);
      return __return_storage_ptr__;
    }
LAB_00102e61:
    unexpected_thing(this);
  }
  iVar1 = std::istream::peek();
  if (iVar1 != 0x2a) goto LAB_00102e61;
  std::istream::get();
  comment(this);
  goto LAB_00102ca7;
}

Assistant:

std::optional<Parse_ast> maybe_parse_term() {
      eat_whitespace();
      auto ch = inp.peek();
      switch (ch) {
      case eof:
      case ')':
        return std::nullopt;
      case '/':
      case '\\': {
        inp.get();
        auto name = get_var();
        get_dot();
        return Parse_ast::Lambda(std::move(name), parse_term());
      }
      case '(': {
        inp.get();
        if (inp.peek() == '*') {
          inp.get();
          comment();
          return maybe_parse_term();
        }
        auto fst = parse_term();
        get_close_paren();
        return parse_app_list(std::move(fst));
      }
      default:
        if (std::isalpha(ch) or ch == '_') {
          return parse_app_list(Parse_ast::Variable(get_var()));
        } else {
          unexpected_thing();
        }
      }
    }